

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void map_evacuate(void *map_evacuate_void)

{
  long lVar1;
  Character *pCVar2;
  World *pWVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  mapped_type *pmVar7;
  reference ppCVar8;
  reference ppCVar9;
  Character *character_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<Character_*,_std::allocator<Character_*>_> *__range2_2;
  Character *character_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<Character_*,_std::allocator<Character_*>_> *__range2_1;
  vector<Character_*,_std::allocator<Character_*>_> evac_chars;
  key_type local_130;
  allocator<char> local_109;
  key_type local_108;
  int local_e8;
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  Character *local_a0;
  Character *character;
  iterator __end2;
  iterator __begin2;
  list<Character_*,_std::allocator<Character_*>_> *__range2;
  undefined1 local_78 [6];
  bool step;
  allocator<char> local_41;
  key_type local_40;
  int local_1c;
  long *plStack_18;
  int ticks_per_step;
  map_evacuate_struct *evac;
  void *map_evacuate_void_local;
  
  lVar1 = **map_evacuate_void;
  plStack_18 = (long *)map_evacuate_void;
  evac = (map_evacuate_struct *)map_evacuate_void;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"EvacuateStep",&local_41);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)(lVar1 + 0x198),&local_40);
  iVar5 = util::variant::operator_cast_to_int(pmVar7);
  lVar1 = *(long *)*plStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"EvacuateTick",(allocator<char> *)((long)&__range2 + 7));
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)(lVar1 + 0x198),(key_type *)local_78);
  iVar6 = util::variant::operator_cast_to_int(pmVar7);
  iVar5 = iVar5 / iVar6;
  std::__cxx11::string::~string((string *)local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_1c = iVar5;
  if ((int)plStack_18[1] < 1) {
    std::vector<Character_*,_std::allocator<Character_*>_>::vector
              ((vector<Character_*,_std::allocator<Character_*>_> *)&__range2_1);
    lVar1 = *plStack_18;
    __end2_1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin
                         ((list<Character_*,_std::allocator<Character_*>_> *)(lVar1 + 0x20));
    character_1 = (Character *)
                  std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end
                            ((list<Character_*,_std::allocator<Character_*>_> *)(lVar1 + 0x20));
    while( true ) {
      bVar4 = std::operator!=(&__end2_1,(_Self *)&character_1);
      if (!bVar4) break;
      ppCVar8 = std::_List_iterator<Character_*>::operator*(&__end2_1);
      __range2_2 = (vector<Character_*,_std::allocator<Character_*>_> *)*ppCVar8;
      iVar6 = (**(((Character *)__range2_2)->super_Command_Source)._vptr_Command_Source)();
      if ((char)iVar6 == '\0') {
        std::vector<Character_*,_std::allocator<Character_*>_>::push_back
                  ((vector<Character_*,_std::allocator<Character_*>_> *)&__range2_1,
                   (value_type *)&__range2_2);
      }
      std::_List_iterator<Character_*>::operator++(&__end2_1);
    }
    __end2_2 = std::vector<Character_*,_std::allocator<Character_*>_>::begin
                         ((vector<Character_*,_std::allocator<Character_*>_> *)&__range2_1);
    character_2 = (Character *)
                  std::vector<Character_*,_std::allocator<Character_*>_>::end
                            ((vector<Character_*,_std::allocator<Character_*>_> *)&__range2_1);
    while( true ) {
      bVar4 = __gnu_cxx::operator!=
                        (&__end2_2,
                         (__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                          *)&character_2);
      if (!bVar4) break;
      ppCVar9 = __gnu_cxx::
                __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                ::operator*(&__end2_2);
      World::Jail((*ppCVar9)->world,(Command_Source *)0x0,*ppCVar9,false);
      __gnu_cxx::
      __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
      operator++(&__end2_2);
    }
    *(undefined1 *)(*plStack_18 + 200) = 0;
    if (plStack_18 != (long *)0x0) {
      operator_delete(plStack_18,0x10);
    }
    std::vector<Character_*,_std::allocator<Character_*>_>::~vector
              ((vector<Character_*,_std::allocator<Character_*>_> *)&__range2_1);
  }
  else {
    __range2._6_1_ = (int)plStack_18[1] % iVar5 == 0;
    lVar1 = *plStack_18;
    __end2 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin
                       ((list<Character_*,_std::allocator<Character_*>_> *)(lVar1 + 0x20));
    character = (Character *)
                std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end
                          ((list<Character_*,_std::allocator<Character_*>_> *)(lVar1 + 0x20));
    while( true ) {
      bVar4 = std::operator!=(&__end2,(_Self *)&character);
      if (!bVar4) break;
      ppCVar8 = std::_List_iterator<Character_*>::operator*(&__end2);
      pCVar2 = *ppCVar8;
      local_a0 = pCVar2;
      if ((__range2._6_1_ & 1) != 0) {
        pWVar3 = pCVar2->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"map_evacuate",&local_e1);
        iVar6 = (int)plStack_18[1] / local_1c;
        lVar1 = *(long *)*plStack_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"EvacuateStep",&local_109);
        pmVar7 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                               *)(lVar1 + 0x198),&local_108);
        local_e8 = util::variant::operator_cast_to_int(pmVar7);
        local_e8 = iVar6 * local_e8;
        I18N::Format<int>(&local_c0,&pWVar3->i18n,&local_e0,&local_e8);
        (*(pCVar2->super_Command_Source)._vptr_Command_Source[5])(pCVar2,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator(&local_109);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator(&local_e1);
      }
      pCVar2 = local_a0;
      lVar1 = *(long *)*plStack_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"EvacuateSound",
                 (allocator<char> *)
                 ((long)&evac_chars.super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      pmVar7 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             *)(lVar1 + 0x198),&local_130);
      iVar6 = util::variant::operator_cast_to_int(pmVar7);
      Character::PlaySound(pCVar2,(uchar)iVar6);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&evac_chars.super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::_List_iterator<Character_*>::operator++(&__end2);
    }
    *(int *)(plStack_18 + 1) = (int)plStack_18[1] + -1;
  }
  return;
}

Assistant:

void map_evacuate(void *map_evacuate_void)
{
	map_evacuate_struct *evac(static_cast<map_evacuate_struct *>(map_evacuate_void));

	int ticks_per_step = int(evac->map->world->config["EvacuateStep"]) / int(evac->map->world->config["EvacuateTick"]);

	if (evac->step > 0)
	{
		bool step = evac->step % ticks_per_step == 0;

		UTIL_FOREACH(evac->map->characters, character)
		{
			if (step)
				character->ServerMsg(character->world->i18n.Format("map_evacuate", (evac->step / ticks_per_step) * int(evac->map->world->config["EvacuateStep"])));

			character->PlaySound(int(evac->map->world->config["EvacuateSound"]));
		}

		--evac->step;
	}
	else
	{
		std::vector<Character*> evac_chars;

		UTIL_FOREACH(evac->map->characters, character)
		{
			if (character->SourceAccess() < ADMIN_GUIDE)
			{
				evac_chars.push_back(character);
			}
		}

		UTIL_FOREACH(evac_chars, character)
		{
			character->world->Jail(0, character, false);
		}

		evac->map->evacuate_lock = false;
		delete evac;
	}
}